

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

double * getMODWTmra(wt_object wt,double *wavecoeffs)

{
  undefined8 *puVar1;
  uint N;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  fft_data *high_pass;
  fft_object obj;
  fft_object fft_bd;
  fft_data *inp;
  fft_data *cA;
  fft_data *cD;
  fft_data *det;
  fft_data *oup;
  fft_data *oup_00;
  int *index;
  double *pdVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  fft_data *high_pass_00;
  size_t __size;
  uint uVar11;
  
  N = wt->modwtsiglength;
  high_pass = (fft_data *)(long)(int)N;
  high_pass_00 = (fft_data *)(ulong)N;
  uVar2 = wt->wave->lpd_len;
  iVar5 = strcmp(wt->ext,"sym");
  if (iVar5 == 0) {
    uVar11 = (int)N / 2;
  }
  else {
    strcmp(wt->ext,"per");
    uVar11 = N;
  }
  iVar5 = wt->J;
  obj = fft_init(N,1);
  fft_bd = fft_init(N,-1);
  __size = (long)high_pass << 4;
  inp = (fft_data *)malloc(__size);
  cA = (fft_data *)malloc(__size);
  cD = (fft_data *)malloc(__size);
  det = (fft_data *)malloc(__size);
  oup = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  index = (int *)malloc((long)high_pass * 4);
  pdVar6 = (double *)malloc((long)(int)uVar11 * ((long)iVar5 + 1) * 8);
  if (0 < (int)uVar2) {
    pdVar4 = wt->wave->lpd;
    lVar8 = 0;
    do {
      *(double *)((long)&inp->re + lVar8 * 2) =
           *(double *)((long)pdVar4 + lVar8) / 1.4142135623730951;
      *(undefined8 *)((long)&inp->im + lVar8 * 2) = 0;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar2 * 8 - lVar8 != 0);
  }
  if ((int)uVar2 < (int)N) {
    memset(inp + (int)uVar2,0,(ulong)(~uVar2 + N) * 0x10 + 0x10);
  }
  fft_exec(obj,inp,oup);
  if (0 < (int)uVar2) {
    pdVar4 = wt->wave->hpd;
    lVar8 = 0;
    do {
      *(double *)((long)&inp->re + lVar8 * 2) =
           *(double *)((long)pdVar4 + lVar8) / 1.4142135623730951;
      *(undefined8 *)((long)&inp->im + lVar8 * 2) = 0;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar2 * 8 - lVar8 != 0);
  }
  if ((int)uVar2 < (int)N) {
    memset(inp + (int)uVar2,0,(ulong)(~uVar2 + N) * 0x10 + 0x10);
  }
  fft_exec(obj,inp,oup_00);
  if ((int)N < 1) {
    exp2((double)iVar5 + -1.0);
  }
  else {
    lVar8 = 0;
    do {
      *(ulong *)((long)&oup->im + lVar8) = *(ulong *)((long)&oup->im + lVar8) ^ 0x8000000000000000;
      lVar8 = lVar8 + 0x10;
    } while ((long)high_pass_00 << 4 != lVar8);
    lVar8 = 0;
    do {
      *(ulong *)((long)&oup_00->im + lVar8) =
           *(ulong *)((long)&oup_00->im + lVar8) ^ 0x8000000000000000;
      lVar8 = lVar8 + 0x10;
    } while ((long)high_pass_00 << 4 != lVar8);
    exp2((double)iVar5 + -1.0);
    if (0 < (int)N) {
      pdVar4 = wt->output;
      lVar8 = 0;
      do {
        *(undefined8 *)((long)&inp->re + lVar8 * 2) = *(undefined8 *)((long)pdVar4 + lVar8);
        *(undefined8 *)((long)&inp->im + lVar8 * 2) = 0;
        puVar1 = (undefined8 *)((long)&det->re + lVar8 * 2);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar8 = lVar8 + 8;
      } while ((long)high_pass_00 * 8 - lVar8 != 0);
    }
  }
  getMODWTRecCoeff(obj,fft_bd,inp,det,cA,cD,index,"appx",iVar5,(int)oup,oup_00,high_pass,(int)fft_bd
                  );
  uVar9 = (ulong)wt->siglength;
  if (0 < (long)uVar9) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pdVar6 + lVar8) = *(undefined8 *)((long)&inp->re + lVar8 * 2);
      lVar8 = lVar8 + 8;
    } while (uVar9 * 8 - lVar8 != 0);
  }
  if (0 < iVar5) {
    iVar10 = 0;
    lVar8 = (long)high_pass * 8;
    do {
      if (0 < (int)N) {
        pdVar4 = wt->output;
        lVar7 = 0;
        do {
          *(undefined8 *)((long)&inp->re + lVar7 * 2) =
               *(undefined8 *)((long)pdVar4 + lVar7 + lVar8);
          *(undefined8 *)((long)&inp->im + lVar7 * 2) = 0;
          puVar1 = (undefined8 *)((long)&det->re + lVar7 * 2);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar7 = lVar7 + 8;
        } while ((long)high_pass_00 * 8 - lVar7 != 0);
      }
      getMODWTRecCoeff(obj,fft_bd,inp,det,cA,cD,index,"det",iVar5 - iVar10,(int)oup,oup_00,
                       high_pass_00,(int)fft_bd);
      iVar3 = wt->siglength;
      if (0 < (long)iVar3) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)pdVar6 + lVar7 + (long)(int)uVar9 * 8) =
               *(undefined8 *)((long)&inp->re + lVar7 * 2);
          lVar7 = lVar7 + 8;
        } while ((long)iVar3 * 8 - lVar7 != 0);
      }
      iVar10 = iVar10 + 1;
      lVar8 = lVar8 + (long)high_pass * 8;
      uVar9 = (ulong)(uint)(iVar3 + (int)uVar9);
    } while (iVar10 != iVar5);
  }
  free(det);
  free(index);
  free(inp);
  free(cA);
  free(cD);
  free(oup);
  free(oup_00);
  free_fft(obj);
  free_fft(fft_bd);
  return pdVar6;
}

Assistant:

double* getMODWTmra(wt_object wt, double *wavecoeffs) {
	double *mra;
	int i, J, temp_len, iter, M, N, len_avg,lmra;
	int lenacc;
	double s;
	fft_data  *cA, *cD, *low_pass, *high_pass, *sig,*ninp;
	int *index;
	fft_object fft_fd = NULL;
	fft_object fft_bd = NULL;

	N = wt->modwtsiglength;
	len_avg = wt->wave->lpd_len;
	if (!strcmp(wt->ext, "sym")) {
		temp_len = N / 2;
	}
	else if (!strcmp(wt->ext, "per")) {
		temp_len = N;
	}
	J = wt->J;

	s = sqrt(2.0);
	fft_fd = fft_init(N, 1);
	fft_bd = fft_init(N, -1);

	sig = (fft_data*)malloc(sizeof(fft_data)* N);
	cA = (fft_data*)malloc(sizeof(fft_data)* N);
	cD = (fft_data*)malloc(sizeof(fft_data)* N);
	ninp = (fft_data*)malloc(sizeof(fft_data)* N);
	low_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	high_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	index = (int*)malloc(sizeof(int)*N);
	mra = (double*)malloc(sizeof(double)*temp_len*(J + 1));

	// N-point FFT of low pass and high pass filters

	// Low Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->lpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}


	fft_exec(fft_fd, sig, low_pass);

	// High Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->hpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}

	fft_exec(fft_fd, sig, high_pass);


	// Complex conjugate of the two filters

	conj_complex(low_pass, N);
	conj_complex(high_pass, N);

	M = (int)pow(2.0, (double)J - 1.0);
	lenacc = N;

	// 
	for (i = 0; i < N; ++i) {
		sig[i].re = (fft_type)wt->output[i];
		sig[i].im = 0.0;
		ninp[i].re = 0.0;
		ninp[i].im = 0.0;
	}

	// Find Approximation MRA

	getMODWTRecCoeff(fft_fd,fft_bd,sig,ninp,cA,cD,index,"appx",J,J,low_pass,high_pass,N);

	for (i = 0; i < wt->siglength; ++i) {
		mra[i] = sig[i].re;
	}
	lmra = wt->siglength;
	// Find Details MRA

	for (iter = 0; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			sig[i].re = (fft_type)wt->output[lenacc+i];
			sig[i].im = 0.0;
			ninp[i].re = 0.0;
			ninp[i].im = 0.0;
		}

		getMODWTRecCoeff(fft_fd, fft_bd, sig, ninp,cA, cD, index, "det", J-iter, J, low_pass, high_pass, N);

		for (i = 0; i < wt->siglength; ++i) {
			mra[lmra+i] = sig[i].re;
		}

		lenacc += N;
		lmra += wt->siglength;
	}

	free(ninp);
	free(index);
	free(sig);
	free(cA);
	free(cD);
	free(low_pass);
	free(high_pass);
	free_fft(fft_fd);
	free_fft(fft_bd);

	return mra;
}